

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

ostream * pstore::repo::operator<<(ostream *os,section_kind kind)

{
  size_t sVar1;
  char *__s;
  
  if (kind < last) {
    __s = &DAT_001b8120 + *(int *)(&DAT_001b8120 + (ulong)kind * 4);
  }
  else {
    __s = "unknown section_kind";
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  return os;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_kind const kind) {
            auto str = "unknown section_kind";
#define X(a)                                                                                       \
    case section_kind::a: str = #a; break;
            switch (kind) {
                PSTORE_MCREPO_SECTION_KINDS
            case section_kind::last: break;
            }
            return os << str;
#undef X
        }